

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::Resize
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this,int64_t newsize)

{
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar1;
  _Invoker_type p_Var2;
  ostream *poVar3;
  int64_t *piVar4;
  long lVar5;
  long lVar6;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar7;
  bool bVar8;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  lVar6 = this->fNElements;
  if (lVar6 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pfVar7 = this->fStore;
      if (pfVar7 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
        p_Var2 = pfVar7[-1]._M_invoker;
        if (p_Var2 != (_Invoker_type)0x0) {
          lVar6 = (long)p_Var2 << 5;
          do {
            std::_Function_base::~_Function_base
                      ((_Function_base *)((long)&pfVar7[-1].super__Function_base._M_functor + lVar6)
                      );
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__(&pfVar7[-1]._M_invoker,(long)p_Var2 << 5 | 8);
      }
      this->fStore = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0;
    }
    else {
      lVar5 = 0;
      piVar4 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize << 5 | 8);
      *piVar4 = newsize;
      pfVar7 = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)(piVar4 + 1);
      memset(pfVar7,0,newsize << 5);
      if (newsize <= lVar6) {
        lVar6 = newsize;
      }
      if (lVar6 < 1) {
        lVar6 = lVar5;
      }
      while( true ) {
        pfVar1 = this->fStore;
        bVar8 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        if (bVar8) break;
        std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=
                  ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                   ((long)&(pfVar7->super__Function_base)._M_functor + lVar5),
                   (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                   ((long)&(pfVar1->super__Function_base)._M_functor + lVar5));
        lVar5 = lVar5 + 0x20;
      }
      if (pfVar1 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
        p_Var2 = pfVar1[-1]._M_invoker;
        if (p_Var2 != (_Invoker_type)0x0) {
          lVar6 = (long)p_Var2 << 5;
          do {
            std::_Function_base::~_Function_base
                      ((_Function_base *)((long)&pfVar1[-1].super__Function_base._M_functor + lVar6)
                      );
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__(&pfVar1[-1]._M_invoker,(long)p_Var2 << 5 | 8);
      }
      this->fStore = pfVar7;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}